

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O3

void __thiscall ccs::Value::str(Value *this)

{
  runtime_error *this_00;
  char *pcVar1;
  ostringstream msg;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  switch(this->which_) {
  case String:
    StringVal::str_abi_cxx11_(&local_1b0,&this->rawStringVal_);
    goto LAB_0012e2f3;
  case Int:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<long>((long)local_190);
    std::__cxx11::stringbuf::str();
    break;
  case Double:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<double>((this->rawPrimVal_).doubleVal);
    std::__cxx11::stringbuf::str();
    break;
  case Bool:
    pcVar1 = "false";
    if ((ulong)(this->rawPrimVal_).boolVal != 0) {
      pcVar1 = "true";
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,pcVar1,pcVar1 + ((ulong)(this->rawPrimVal_).boolVal ^ 5));
    goto LAB_0012e2f3;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Bad enum value ",0xf);
    std::ostream::operator<<((ostream *)local_190,this->which_);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,(string *)&local_1b0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
LAB_0012e2f3:
  std::__cxx11::string::operator=((string *)&this->strVal_,(string *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Value::str()
  { strVal_ = accept<std::string>(ToString()); }